

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_log_messages.cpp
# Opt level: O3

void HandleMessageCallback(Message *message,void *userData)

{
  hrgls_MessageLevel hVar1;
  ostream *poVar2;
  string local_38;
  
  *(long *)userData = *userData + 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Callback message with level ",0x1c);
  hVar1 = hrgls::Message::Level(message);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,hVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," received: ",0xb);
  hrgls::Message::Value_abi_cxx11_(&local_38,message);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HandleMessageCallback(hrgls::Message &message, void *userData)
{
  // Increment to keep track of how many messages arrived.
  size_t *count = static_cast<size_t*>(userData);
  (*count)++;

  // Print the message
  std::cout << "Callback message with level " << message.Level()
    << " received: " << message.Value() << std::endl;
}